

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O1

void __thiscall wasm::InlineMainPass::run(InlineMainPass *this,Module *module)

{
  Expression *pEVar1;
  Function *into;
  Function *pFVar2;
  ulong in_RCX;
  Expression **ppEVar3;
  undefined1 auVar4 [8];
  Expression **ppEVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  string_view sVar9;
  InliningAction local_88;
  undefined1 local_70 [8];
  FindAllPointers<wasm::Call> calls;
  
  sVar9 = IString::interned((IString *)0x4,(string_view)ZEXT816(0xdddf7f),SUB81(in_RCX,0));
  into = Module::getFunctionOrNull(module,(Name)sVar9);
  sVar9 = IString::interned((IString *)0xf,(string_view)ZEXT816(0xe00115),SUB81(in_RCX,0));
  pFVar2 = Module::getFunctionOrNull(module,(Name)sVar9);
  if ((((into != (Function *)0x0) && (pFVar2 != (Function *)0x0)) &&
      ((into->super_Importable).module.super_IString.str._M_str == (char *)0x0)) &&
     ((pFVar2->super_Importable).module.super_IString.str._M_str == (char *)0x0)) {
    FindAllPointers<wasm::Call>::FindAllPointers
              ((FindAllPointers<wasm::Call> *)local_70,&into->body);
    calls.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         calls.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
         _M_impl.super__Vector_impl_data._M_start;
    bVar8 = local_70 !=
            (undefined1  [8])
            calls.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if (local_70 ==
        (undefined1  [8])
        calls.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      ppEVar5 = (Expression **)0x0;
    }
    else {
      ppEVar5 = (Expression **)0x0;
      auVar4 = local_70;
      do {
        ppEVar3 = *(Expression ***)auVar4;
        pEVar1 = *ppEVar3;
        if (pEVar1->_id != CallId) {
          __assert_fail("int(_id) == int(T::SpecificId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                        ,0x31b,"T *wasm::Expression::cast() [T = wasm::Call]");
        }
        sVar9 = IString::interned((IString *)0xf,(string_view)ZEXT816(0xe00115),SUB81(in_RCX,0));
        bVar6 = ppEVar5 == (Expression **)0x0;
        if (!bVar6) {
          ppEVar3 = ppEVar5;
        }
        bVar7 = (char *)pEVar1[3].type.id != sVar9._M_str;
        if (!bVar7) {
          ppEVar5 = ppEVar3;
        }
        in_RCX = (ulong)(bVar7 || bVar6);
        if (!bVar7 && !bVar6) break;
        auVar4 = (undefined1  [8])((long)auVar4 + 8);
        bVar8 = auVar4 != (undefined1  [8])
                          calls.list.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
      } while (bVar8);
    }
    if ((!bVar8) && (ppEVar5 != (Expression **)0x0)) {
      local_88.insideATry = true;
      local_88.nameHint = 0;
      local_88.callSite = ppEVar5;
      local_88.contents = pFVar2;
      anon_unknown_18::doCodeInlining(module,into,&local_88,&((this->super_Pass).runner)->options);
      anon_unknown_18::updateAfterInlining(module,into);
    }
    if (local_70 != (undefined1  [8])0x0) {
      operator_delete((void *)local_70,
                      (long)calls.list.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)local_70);
    }
  }
  return;
}

Assistant:

void run(Module* module) override {
    auto* main = module->getFunctionOrNull(MAIN);
    auto* originalMain = module->getFunctionOrNull(ORIGINAL_MAIN);
    if (!main || main->imported() || !originalMain ||
        originalMain->imported()) {
      return;
    }
    FindAllPointers<Call> calls(main->body);
    Expression** callSite = nullptr;
    for (auto* call : calls.list) {
      if ((*call)->cast<Call>()->target == ORIGINAL_MAIN) {
        if (callSite) {
          // More than one call site.
          return;
        }
        callSite = call;
      }
    }
    if (!callSite) {
      // No call at all.
      return;
    }
    doInlining(module,
               main,
               InliningAction(callSite, originalMain, true),
               getPassOptions());
  }